

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall
Lodtalk::AST::IdentifierExpression::~IdentifierExpression(IdentifierExpression *this)

{
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__IdentifierExpression_0016fe48;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->variable).
              super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&this->identifier);
  return;
}

Assistant:

IdentifierExpression::~IdentifierExpression()
{
}